

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::Swap(MapFieldBase *this,MapFieldBase *other)

{
  State SVar1;
  Arena *pAVar2;
  RepeatedPtrField<google::protobuf::Message> *other_00;
  Arena *to_arena;
  Arena *from_arena;
  RepeatedPtrField<google::protobuf::Message> **to;
  RepeatedPtrField<google::protobuf::Message> **from;
  
  from_arena = this->arena_;
  pAVar2 = other->arena_;
  if (from_arena == pAVar2) {
    InternalSwap(this,other);
    return;
  }
  from = &this->repeated_field_;
  other_00 = other->repeated_field_;
  if (this->repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    to_arena = from_arena;
    from_arena = pAVar2;
    to = from;
    from = &other->repeated_field_;
    if (other_00 == (RepeatedPtrField<google::protobuf::Message> *)0x0) goto LAB_003a1219;
  }
  else {
    to_arena = pAVar2;
    to = &other->repeated_field_;
    if (other_00 != (RepeatedPtrField<google::protobuf::Message> *)0x0) {
      RepeatedPtrField<google::protobuf::Message>::Swap(this->repeated_field_,other_00);
      goto LAB_003a1219;
    }
  }
  SwapRepeatedPtrToNull(from,to,from_arena,to_arena);
LAB_003a1219:
  SVar1 = (other->state_)._M_i;
  (other->state_)._M_i = (this->state_)._M_i;
  (this->state_)._M_i = SVar1;
  return;
}

Assistant:

void MapFieldBase::Swap(MapFieldBase* other) {
  if (arena_ == other->arena_) {
    InternalSwap(other);
    return;
  }
  if (repeated_field_ != nullptr || other->repeated_field_ != nullptr) {
    if (repeated_field_ == nullptr) {
      SwapRepeatedPtrToNull(&other->repeated_field_, &repeated_field_,
                            other->arena_, arena_);
    } else if (other->repeated_field_ == nullptr) {
      SwapRepeatedPtrToNull(&repeated_field_, &other->repeated_field_, arena_,
                            other->arena_);
    } else {
      repeated_field_->Swap(other->repeated_field_);
    }
  }
  SwapState(other);
}